

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setGraphicsEffect(QWidget *this,QGraphicsEffect *effect)

{
  QWidgetPrivate *this_00;
  QWidgetEffectSourcePrivate *this_01;
  QGraphicsEffectSource *this_02;
  long in_FS_OFFSET;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if (this_00->graphicsEffect != effect) {
    if (this_00->graphicsEffect != (QGraphicsEffect *)0x0) {
      local_40 = rect(this);
      QWidgetPrivate::invalidateBackingStore<QRect>(this_00,&local_40);
      if (this_00->graphicsEffect != (QGraphicsEffect *)0x0) {
        (**(code **)(*(long *)this_00->graphicsEffect + 0x20))();
      }
      this_00->graphicsEffect = (QGraphicsEffect *)0x0;
    }
    if (effect != (QGraphicsEffect *)0x0) {
      this_01 = (QWidgetEffectSourcePrivate *)operator_new(0xf8);
      QWidgetEffectSourcePrivate::QWidgetEffectSourcePrivate(this_01,this);
      this_02 = (QGraphicsEffectSource *)operator_new(0x10);
      QGraphicsEffectSource::QGraphicsEffectSource
                (this_02,(QGraphicsEffectSourcePrivate *)this_01,(QObject *)0x0);
      this_00->graphicsEffect = effect;
      QGraphicsEffectPrivate::setGraphicsEffectSource
                (*(QGraphicsEffectPrivate **)&effect->field_0x8,(QGraphicsEffectSource *)this_02);
      update(this);
    }
    QWidgetPrivate::updateIsOpaque(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setGraphicsEffect(QGraphicsEffect *effect)
{
    Q_D(QWidget);
    if (d->graphicsEffect == effect)
        return;

    if (d->graphicsEffect) {
        d->invalidateBackingStore(rect());
        delete d->graphicsEffect;
        d->graphicsEffect = nullptr;
    }

    if (effect) {
        // Set new effect.
        QGraphicsEffectSourcePrivate *sourced = new QWidgetEffectSourcePrivate(this);
        QGraphicsEffectSource *source = new QGraphicsEffectSource(*sourced);
        d->graphicsEffect = effect;
        effect->d_func()->setGraphicsEffectSource(source);
        update();
    }

    d->updateIsOpaque();
}